

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  char *pcVar1;
  byte bVar2;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  size_t sVar3;
  char *__dest;
  undefined8 *puVar4;
  runtime_error *this_01;
  ushort uVar5;
  CommentInfo *this_02;
  uint uVar6;
  long lVar7;
  
  bVar2 = (byte)*(ushort *)&other->field_0x8;
  uVar5 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | *(ushort *)&other->field_0x8 & 0xff;
  *(ushort *)&this->field_0x8 = uVar5;
  this->comments_ = (CommentInfo *)0x0;
  if (7 < bVar2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x1e9,"Json::Value::Value(const Value &)");
  }
  if ((0x2fU >> (bVar2 & 0x1f) & 1) == 0) {
    if ((0xc0U >> (bVar2 & 0x1f) & 1) == 0) {
      pcVar1 = (other->value_).string_;
      if (pcVar1 == (char *)0x0) {
        (this->value_).int_ = 0;
      }
      else {
        sVar3 = strlen(pcVar1);
        uVar6 = 0x7ffffffe;
        if ((uint)sVar3 < 0x7ffffffe) {
          uVar6 = (uint)sVar3;
        }
        __dest = (char *)malloc((ulong)(uVar6 + 1));
        if (__dest == (char *)0x0) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Failed to allocate string value buffer");
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        memcpy(__dest,pcVar1,(ulong)uVar6);
        __dest[uVar6] = '\0';
        (this->value_).string_ = __dest;
        *(ushort *)&this->field_0x8 = uVar5 | 0x100;
      }
    }
    else {
      this_00 = (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 *)operator_new(0x30);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_Rb_tree(this_00,&((other->value_).map_)->_M_t);
      (this->value_).map_ = (ObjectValues *)this_00;
    }
  }
  else {
    this->value_ = other->value_;
  }
  if (other->comments_ != (CommentInfo *)0x0) {
    puVar4 = (undefined8 *)operator_new__(0x20);
    *puVar4 = 3;
    lVar7 = 0;
    this_02 = (CommentInfo *)(puVar4 + 1);
    do {
      CommentInfo::CommentInfo(this_02);
      lVar7 = lVar7 + -8;
      this_02 = this_02 + 1;
    } while (lVar7 != -0x18);
    this->comments_ = (CommentInfo *)(puVar4 + 1);
    lVar7 = 0;
    do {
      pcVar1 = *(char **)((long)&other->comments_->comment_ + lVar7);
      if (pcVar1 != (char *)0x0) {
        CommentInfo::setComment((CommentInfo *)((long)&this->comments_->comment_ + lVar7),pcVar1);
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x18);
  }
  return;
}

Assistant:

Value::Value( const Value &other )
   : type_( other.type_ )
   , allocated_( false )
# ifdef JSON_VALUE_USE_INTERNAL_MAP
   , itemIsUsed_( 0 )
#endif
   , comments_( 0 )
{
   switch ( type_ )
   {
   case nullValue:
   case intValue:
   case uintValue:
   case realValue:
   case booleanValue:
      value_ = other.value_;
      break;
   case stringValue:
      if ( other.value_.string_ )
      {
         value_.string_ = duplicateStringValue( other.value_.string_ );
         allocated_ = true;
      }
      else
         value_.string_ = 0;
      break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
   case objectValue:
      value_.map_ = new ObjectValues( *other.value_.map_ );
      break;
#else
   case arrayValue:
      value_.array_ = arrayAllocator()->newArrayCopy( *other.value_.array_ );
      break;
   case objectValue:
      value_.map_ = mapAllocator()->newMapCopy( *other.value_.map_ );
      break;
#endif
   default:
      JSON_ASSERT_UNREACHABLE;
   }
   if ( other.comments_ )
   {
      comments_ = new CommentInfo[numberOfCommentPlacement];
      for ( int comment =0; comment < numberOfCommentPlacement; ++comment )
      {
         const CommentInfo &otherComment = other.comments_[comment];
         if ( otherComment.comment_ )
            comments_[comment].setComment( otherComment.comment_ );
      }
   }
}